

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

double __thiscall
HighsMipSolverData::computeNewUpperLimit
          (HighsMipSolverData *this,double ub,double mip_abs_gap,double mip_rel_gap)

{
  bool bVar1;
  pointer pHVar2;
  double *pdVar3;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  double in_XMM1_Qa;
  double dVar6;
  double in_XMM2_Qa;
  double new_upper_limit;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  bVar1 = HighsObjectiveFunction::isIntegral((HighsObjectiveFunction *)(in_RDI + 0xbe3));
  if (bVar1) {
    dVar4 = HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
    dVar5 = floor(dVar4 * local_10 + -0.5);
    local_28 = HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
    dVar4 = local_10;
    local_28 = dVar5 / local_28;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      dVar6 = local_10 + *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8);
      dVar5 = HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
      pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x623e31);
      dVar5 = ceil(local_20 * ABS(dVar6) * dVar5 + -pHVar2->epsilon);
      dVar6 = HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
      local_30 = dVar4 - dVar5 / dVar6;
      pdVar3 = std::min<double>(&local_28,&local_30);
      local_28 = *pdVar3;
    }
    if ((local_18 != 0.0) || (NAN(local_18))) {
      dVar4 = HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
      pHVar2 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x623f1d);
      dVar4 = ceil(local_18 * dVar4 + -pHVar2->epsilon);
      dVar5 = HighsObjectiveFunction::integralScale((HighsObjectiveFunction *)(in_RDI + 0xbe3));
      local_38 = local_10 - dVar4 / dVar5;
      pdVar3 = std::min<double>(&local_28,&local_38);
      local_28 = *pdVar3;
    }
    local_28 = (double)in_RDI[0xcc4] + local_28;
  }
  else {
    local_40 = local_10 - (double)in_RDI[0xcc4];
    local_48 = nextafter(local_10,-INFINITY);
    pdVar3 = std::min<double>(&local_40,&local_48);
    local_28 = *pdVar3;
    if ((local_20 != 0.0) || (NAN(local_20))) {
      local_50 = -local_20 * ABS(local_10 + *(double *)(*(long *)(*in_RDI + 0x10) + 0xf8)) +
                 local_10;
      pdVar3 = std::min<double>(&local_28,&local_50);
      local_28 = *pdVar3;
    }
    if ((local_18 != 0.0) || (NAN(local_18))) {
      local_58 = local_10 - local_18;
      pdVar3 = std::min<double>(&local_28,&local_58);
      local_28 = *pdVar3;
    }
  }
  return local_28;
}

Assistant:

double HighsMipSolverData::computeNewUpperLimit(double ub, double mip_abs_gap,
                                                double mip_rel_gap) const {
  double new_upper_limit;
  if (objectiveFunction.isIntegral()) {
    new_upper_limit =
        (std::floor(objectiveFunction.integralScale() * ub - 0.5) /
         objectiveFunction.integralScale());

    if (mip_rel_gap != 0.0)
      new_upper_limit = std::min(
          new_upper_limit,
          ub - std::ceil(mip_rel_gap * fabs(ub + mipsolver.model_->offset_) *
                             objectiveFunction.integralScale() -
                         mipsolver.mipdata_->epsilon) /
                   objectiveFunction.integralScale());

    if (mip_abs_gap != 0.0)
      new_upper_limit = std::min(
          new_upper_limit,
          ub - std::ceil(mip_abs_gap * objectiveFunction.integralScale() -
                         mipsolver.mipdata_->epsilon) /
                   objectiveFunction.integralScale());

    // add feasibility tolerance so that the next best integer feasible solution
    // is definitely included in the remaining search
    new_upper_limit += feastol;
  } else {
    new_upper_limit = std::min(ub - feastol, std::nextafter(ub, -kHighsInf));

    if (mip_rel_gap != 0.0)
      new_upper_limit =
          std::min(new_upper_limit,
                   ub - mip_rel_gap * fabs(ub + mipsolver.model_->offset_));

    if (mip_abs_gap != 0.0)
      new_upper_limit = std::min(new_upper_limit, ub - mip_abs_gap);
  }

  return new_upper_limit;
}